

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

uint crnlib::rg_etc1::pack_etc2_alpha
               (void *pBlock,uint *pSrc_pixels_rgba,etc2a_pack_params *pack_params)

{
  byte *pbVar1;
  sbyte sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 uVar7;
  int i;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  undefined4 *puVar15;
  uint uVar16;
  uint uVar17;
  uint d;
  uint uVar18;
  uint i_1;
  bool bVar19;
  uint8 data [8];
  uint8 values [8];
  results results;
  uint8 selectors [16];
  params params;
  dxt5_endpoint_optimizer dxt5_optimizer;
  uint local_51c;
  byte bStack_517;
  undefined4 uStack_516;
  undefined2 uStack_512;
  uint local_510;
  uint local_50c;
  undefined8 *local_508;
  ulong local_500;
  undefined4 *local_4f8;
  long local_4f0;
  byte abStack_4e8 [8];
  results local_4e0;
  uint8 local_4c8 [24];
  params local_4b0;
  dxt5_endpoint_optimizer local_490;
  
  local_508 = (undefined8 *)pBlock;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  local_4e0.m_pSelectors = local_4c8;
  local_4b0.m_block_index = 0;
  local_4b0.m_comp_index = pack_params->comp_index;
  local_4b0.m_num_pixels = 0x10;
  local_4b0.m_quality = (pack_params->m_quality == cMediumQuality) + cCRNDXTQualityFast;
  if (pack_params->m_quality == cHighQuality) {
    local_4b0.m_quality = cCRNDXTQualityUber;
  }
  local_4b0.m_use_both_block_types = false;
  local_4b0.m_pPixels = (color_quad_u8 *)pSrc_pixels_rgba;
  dxt5_endpoint_optimizer::compute(&local_490,&local_4b0,&local_4e0);
  local_50c = (uint)local_4e0.m_first_endpoint + (uint)local_4e0.m_second_endpoint + 1 >> 1;
  local_500 = (ulong)((uint)local_4e0.m_first_endpoint - (uint)local_4e0.m_second_endpoint);
  local_51c = 0xffffffff;
  puVar15 = &g_etc2a_modifier_table;
  lVar13 = 0;
  local_510 = local_50c & 0xff;
  do {
    iVar3 = *(int *)(&DAT_001ae2cc + lVar13 * 0x20);
    iVar3 = ((iVar3 >> 1) + (int)local_500 + iVar3) / (iVar3 * 2);
    if (0xe < iVar3) {
      iVar3 = 0xf;
    }
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    uVar7 = (undefined1)local_50c;
    bStack_517 = (char)(iVar3 << 4) + (char)lVar13;
    uStack_512 = 0;
    uStack_516 = 0;
    lVar8 = 0;
    do {
      iVar10 = puVar15[lVar8] * iVar3 + local_510;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      abStack_4e8[lVar8] = (byte)iVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    local_4f8 = puVar15;
    local_4f0 = lVar13;
    uVar12 = 3;
    iVar3 = 0;
    uVar6 = 0;
    uVar11 = 0;
    do {
      uVar16 = uVar6 + 3;
      uVar4 = uVar6;
      uVar18 = uVar12;
      do {
        uVar9 = 0;
        uVar6 = 0xffffffff;
        uVar14 = 0;
        do {
          uVar5 = (uint)*(byte *)((long)pSrc_pixels_rgba + (ulong)uVar4 * 4 + 3) -
                  (uint)abStack_4e8[uVar9];
          uVar17 = -uVar5;
          if (0 < (int)uVar5) {
            uVar17 = uVar5;
          }
          if (uVar17 < uVar6) {
            uVar14 = uVar9 & 0xffffffff;
            uVar6 = uVar17;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 8);
        sVar2 = (sbyte)(uVar18 & 7);
        pbVar1 = (byte *)((long)&uStack_516 + (ulong)(uVar18 >> 3));
        *pbVar1 = *pbVar1 | (byte)((uint)uVar14 << (8U - sVar2 & 0x1f));
        if ((uVar18 & 7) < 3) {
          (&bStack_517)[uVar18 >> 3] = (&bStack_517)[uVar18 >> 3] | (byte)((uint)uVar14 >> sVar2);
        }
        uVar11 = uVar11 + uVar6 * uVar6;
        uVar6 = uVar4 + 1;
        uVar18 = uVar18 + 0xc;
        bVar19 = uVar4 != uVar16;
        uVar4 = uVar6;
      } while (bVar19);
      iVar3 = iVar3 + 1;
      uVar12 = uVar12 + 3;
    } while (iVar3 != 4);
    if (uVar11 < local_51c) {
      *local_508 = CONCAT26(uStack_512,CONCAT42(uStack_516,CONCAT11(bStack_517,uVar7)));
      local_51c = uVar11;
    }
    lVar13 = local_4f0 + 1;
    puVar15 = local_4f8 + 8;
  } while (lVar13 != 0x10);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return local_51c;
}

Assistant:

unsigned int pack_etc2_alpha(void* pBlock, const unsigned int* pSrc_pixels_rgba, etc2a_pack_params& pack_params)
        {
            crnlib::color_quad_u8* pixels = (crnlib::color_quad_u8*)pSrc_pixels_rgba;
            dxt5_endpoint_optimizer dxt5_optimizer;

            dxt5_endpoint_optimizer::results results;
            uint8 selectors[16];
            results.m_pSelectors = selectors;

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = pixels;
            params.m_num_pixels = 16;
            params.m_comp_index = pack_params.comp_index;
            params.m_quality = pack_params.m_quality == cHighQuality ? cCRNDXTQualityUber : pack_params.m_quality == cMediumQuality ? cCRNDXTQualityNormal
                                                                                                                                    : cCRNDXTQualityFast;
            params.m_use_both_block_types = false;
            dxt5_optimizer.compute(params, results);

            uint base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
            uint best_error = cUINT32_MAX;
            for (int modifier_index = 0; modifier_index < 16; modifier_index++)
            {
                const int* modifier = g_etc2a_modifier_table[modifier_index];
                int multiplier = math::clamp<int>((results.m_first_endpoint - results.m_second_endpoint + modifier[7] + (modifier[7] >> 1)) / (modifier[7] << 1), 1, 15);
                uint8 data[8] = { (uint8)base_codeword, (uint8)(multiplier << 4 | modifier_index) }, values[8];
                for (int i = 0; i < 8; i++)
                {
                    values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                uint error = 0;
                for (uint d0 = 3, t = 0, i = 0; i < 4; i++, d0 += 3)
                {
                    for (uint d = d0, j = 0; j < 4; j++, t++, d += 12)
                    {
                        int a = pixels[t].a;
                        uint byte_offset = 2 + (d >> 3);
                        uint bit_offset = d & 7;
                        uint best_s = 0;
                        uint best_delta = cUINT32_MAX;
                        for (uint s = 0; s < 8; s++)
                        {
                            uint delta = abs(a - values[s]);
                            if (delta < best_delta)
                            {
                                best_s = s;
                                best_delta = delta;
                            }
                        }
                        error += best_delta * best_delta;
                        data[byte_offset] |= best_s << (8 - bit_offset);
                        if (bit_offset < 3)
                        {
                            data[byte_offset - 1] |= best_s >> bit_offset;
                        }
                    }
                }
                if (error < best_error)
                {
                    memcpy(pBlock, data, 8);
                    best_error = error;
                }
            }

            return best_error;
        }